

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaping_clipper.cpp
# Opt level: O3

void __thiscall shaping_clipper::generate_spread_table(shaping_clipper *this)

{
  pointer pfVar1;
  pointer ppVar2;
  pointer piVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  int i;
  int iVar16;
  double dVar17;
  int iVar19;
  undefined1 auVar18 [16];
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  iVar19 = this->num_psy_bins;
  if (0 < iVar19) {
    uVar13 = 1;
    lVar15 = 0;
    iVar11 = 0;
    uVar10 = 0;
    auVar23 = _DAT_0010b070;
    auVar24 = _DAT_0010b080;
    auVar25 = _DAT_0010b090;
    do {
      uVar4 = (uint)uVar10;
      iVar7 = uVar4 * 3 + 3;
      if (-1 < (int)(uVar4 * 3)) {
        iVar7 = uVar4 * 3;
      }
      iVar7 = iVar7 >> 2;
      iVar16 = (int)(uVar4 * 4 + 6) / 3;
      if (iVar19 <= iVar16) {
        iVar16 = iVar19;
      }
      iVar14 = (int)lVar15;
      if (iVar7 < iVar16) {
        iVar6 = iVar19 * iVar14;
        fVar20 = 0.0;
        iVar8 = iVar7;
        do {
          dVar17 = log(((double)iVar8 + 0.5) / ((double)(int)uVar4 + 0.5));
          dVar17 = exp((double)(ABS((float)dVar17) * (float)(&DAT_0010b2c8)[iVar8 < (int)uVar4]));
          fVar20 = fVar20 + (float)dVar17;
          iVar19 = this->num_psy_bins;
          (this->spread_table).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[iVar11 + iVar6 + iVar8 + iVar19 / 2] = (float)dVar17;
          iVar8 = iVar8 + 1;
        } while (iVar16 != iVar8);
        auVar23 = _DAT_0010b070;
        auVar24 = _DAT_0010b080;
        auVar25 = _DAT_0010b090;
        if (iVar7 < iVar16) {
          pfVar1 = (this->spread_table).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar9 = (long)iVar16 - (long)iVar7;
          iVar11 = iVar11 + iVar7 + iVar6 + iVar19 / 2;
          do {
            pfVar1[iVar11] = pfVar1[iVar11] / fVar20;
            iVar11 = iVar11 + 1;
            lVar9 = lVar9 + -1;
            auVar23 = _DAT_0010b070;
            auVar24 = _DAT_0010b080;
            auVar25 = _DAT_0010b090;
          } while (lVar9 != 0);
        }
      }
      ppVar2 = (this->spread_table_range).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      ppVar2[lVar15].first = iVar7 - uVar4;
      ppVar2[lVar15].second = iVar16 - uVar4;
      if ((int)uVar4 < 2) {
        uVar5 = uVar4 + 1;
      }
      else {
        if ((uVar4 & uVar4 - 1) == 0) {
          uVar13 = uVar10 >> 1;
        }
        uVar5 = (int)uVar13 + uVar4;
      }
      if ((int)uVar4 < (int)uVar5) {
        piVar3 = (this->spread_table_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar9 = (long)(int)uVar4;
        lVar12 = ((int)uVar5 - lVar9) + -1;
        auVar18._8_4_ = (int)lVar12;
        auVar18._0_8_ = lVar12;
        auVar18._12_4_ = (int)((ulong)lVar12 >> 0x20);
        auVar18 = auVar18 ^ auVar25;
        uVar10 = 0;
        do {
          auVar21._8_4_ = (int)uVar10;
          auVar21._0_8_ = uVar10;
          auVar21._12_4_ = (int)(uVar10 >> 0x20);
          auVar22 = (auVar21 | auVar24) ^ auVar25;
          iVar19 = auVar18._4_4_;
          if ((bool)(~(iVar19 < auVar22._4_4_ ||
                      auVar18._0_4_ < auVar22._0_4_ && auVar22._4_4_ == iVar19) & 1)) {
            piVar3[lVar9 + uVar10] = iVar14;
          }
          if (auVar22._12_4_ <= auVar18._12_4_ &&
              (auVar22._8_4_ <= auVar18._8_4_ || auVar22._12_4_ != auVar18._12_4_)) {
            piVar3[lVar9 + uVar10 + 1] = iVar14;
          }
          auVar21 = (auVar21 | auVar23) ^ auVar25;
          iVar11 = auVar21._4_4_;
          if (iVar11 <= iVar19 && (iVar11 != iVar19 || auVar21._0_4_ <= auVar18._0_4_)) {
            piVar3[lVar9 + uVar10 + 2] = iVar14;
            piVar3[lVar9 + uVar10 + 3] = iVar14;
          }
          uVar10 = uVar10 + 4;
        } while ((((int)uVar5 - lVar9) + 3U & 0xfffffffffffffffc) != uVar10);
        iVar19 = this->num_psy_bins;
      }
      lVar15 = lVar15 + 1;
      iVar11 = -uVar5;
      uVar10 = (ulong)uVar5;
    } while ((int)uVar5 < iVar19);
  }
  return;
}

Assistant:

void shaping_clipper::generate_spread_table() {
    // Calculate tent-shape function in log-log scale.

    // As an optimization, only consider bins close to "bin"
    // This reduces the number of multiplications needed in calculate_mask_curve
    // The masking contribution at faraway bins is negligeable

    // Another optimization to save memory and speed up the calculation of the
    // spread table is to calculate and store only 2 spread functions per
    // octave, and reuse the same spread function for multiple bins.
    int table_index = 0;
    int bin = 0;
    int increment = 1;
    while (bin < this->num_psy_bins) {
        float sum = 0;
        int base_idx = table_index * this->num_psy_bins;
        int start_bin = bin * 3 / 4;
        int end_bin = std::min(this->num_psy_bins, ((bin + 1) * 4 + 2) / 3);

        for (int j = start_bin; j < end_bin; j++) {
            // add 0.5 so i=0 doesn't get log(0)
            float rel_idx_log = std::abs(log((j + 0.5) / (bin + 0.5)));
            float value;
            if (j >= bin) {
                // mask up
                value = exp(-rel_idx_log * 40);
            } else {
                // mask down
                value = exp(-rel_idx_log * 80);
            }
            // the spreading function is centred in the row
            sum += value;
            this->spread_table[base_idx + this->num_psy_bins / 2 + j - bin] = value;
        }
        // now normalize it
        for (int j = start_bin; j < end_bin; j++) {
            this->spread_table[base_idx + this->num_psy_bins / 2 + j - bin] /= sum;
        }

        this->spread_table_range[table_index] = std::make_pair(start_bin - bin, end_bin - bin);

        int next_bin;
        if (bin <= 1) {
            next_bin = bin + 1;
        } else {
            if ((bin & (bin - 1)) == 0) {
                // power of 2
                increment = bin / 2;
            }
            next_bin = bin + increment;
        }

        // set bins between "bin" and "next_bin" to use this table_index
        for (int i = bin; i < next_bin; i++) {
            this->spread_table_index[i] = table_index;
        }

        bin = next_bin;
        table_index++;
    }
}